

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void border_cb(Fl_Light_Button *i,void *v)

{
  _func_int **pp_Var1;
  int iVar2;
  
  if ((char *)v != "LOAD") {
    Fl_Window::border((Fl_Window *)current_widget->o,(int)(i->super_Fl_Button).value_);
    set_modflag(1);
    return;
  }
  iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
  pp_Var1 = (i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget;
  if (iVar2 != 0) {
    (*pp_Var1[5])(i);
    Fl_Button::value(&i->super_Fl_Button,(uint)((current_widget->o->flags_ & 8) == 0));
    return;
  }
  (*pp_Var1[6])(i);
  return;
}

Assistant:

void border_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->hide(); return;}
    i->show();
    i->value(((Fl_Window*)(current_widget->o))->border());
  } else {
    ((Fl_Window*)(current_widget->o))->border(i->value());
    set_modflag(1);
  }
}